

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printObject(JSPrinter *this,Ref node)

{
  Type TVar1;
  size_t sVar2;
  undefined1 uVar3;
  bool bVar4;
  int iVar5;
  Ref *pRVar6;
  char *s;
  Value *pVVar7;
  uint x;
  ulong uVar8;
  Ref local_58;
  Ref node_local;
  Ref local_48;
  Ref args;
  
  local_58.inst = node.inst;
  maybeSpace(this,'{');
  ensure(this,1);
  sVar2 = this->used;
  this->used = sVar2 + 1;
  this->buffer[sVar2] = '{';
  this->indent = this->indent + 1;
  newline(this);
  pRVar6 = Ref::operator[](&local_58,1);
  local_48.inst = pRVar6->inst;
  if ((local_48.inst)->type == Array) {
    uVar8 = 0;
    do {
      if (((((local_48.inst)->field_1).arr)->
          super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements <= uVar8) {
        this->indent = this->indent + -1;
        newline(this);
        emit(this,'}');
        return;
      }
      if (uVar8 != 0) {
        if (this->pretty == true) {
          emit(this,", ");
        }
        else {
          maybeSpace(this,',');
          ensure(this,1);
          sVar2 = this->used;
          this->used = sVar2 + 1;
          this->buffer[sVar2] = ',';
        }
        newline(this);
      }
      x = (uint)uVar8;
      pRVar6 = Ref::operator[](&local_48,x);
      pRVar6 = Ref::operator[](pRVar6,0);
      TVar1 = pRVar6->inst->type;
      pRVar6 = Ref::operator[](&local_48,x);
      pRVar6 = Ref::operator[](pRVar6,0);
      if (TVar1 == Array) {
        pRVar6 = Ref::operator[](pRVar6,0);
        bVar4 = Ref::operator==(pRVar6,(IString *)&STRING);
        pRVar6 = Ref::operator[](&local_48,x);
        pRVar6 = Ref::operator[](pRVar6,0);
        if (bVar4) {
          pRVar6 = Ref::operator[](pRVar6,1);
          if (pRVar6->inst->type != String) goto LAB_00d22a43;
          pVVar7 = (Value *)(pRVar6->inst->field_1).str.str._M_str;
          bVar4 = true;
          goto LAB_00d22748;
        }
        pRVar6 = Ref::operator[](pRVar6,0);
        bVar4 = Ref::operator==(pRVar6,(IString *)&GETTER);
        s = DAT_010d1a80;
        if (bVar4) {
          pRVar6 = Ref::operator[](&local_48,x);
          pRVar6 = Ref::operator[](pRVar6,0);
          pRVar6 = Ref::operator[](pRVar6,1);
          if (pRVar6->inst->type != String) goto LAB_00d22a43;
          pVVar7 = (Value *)(pRVar6->inst->field_1).str.str._M_str;
          bVar4 = false;
          args.inst = (Value *)0x0;
        }
        else {
          pRVar6 = Ref::operator[](&local_48,x);
          pRVar6 = Ref::operator[](pRVar6,0);
          pRVar6 = Ref::operator[](pRVar6,0);
          bVar4 = Ref::operator==(pRVar6,(IString *)&SETTER);
          s = DAT_010d1a90;
          if (!bVar4) {
            abort();
          }
          pRVar6 = Ref::operator[](&local_48,x);
          pRVar6 = Ref::operator[](pRVar6,0);
          pRVar6 = Ref::operator[](pRVar6,1);
          if (pRVar6->inst->type != String) {
LAB_00d22a43:
            __assert_fail("isString()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                          ,0xeb,"const char *cashew::Value::getCString()");
          }
          pVVar7 = (Value *)(pRVar6->inst->field_1).str.str._M_str;
          pRVar6 = Ref::operator[](&local_48,x);
          pRVar6 = Ref::operator[](pRVar6,0);
          pRVar6 = Ref::operator[](pRVar6,2);
          if (pRVar6->inst->type != String) goto LAB_00d22a43;
          args.inst = (Value *)(pRVar6->inst->field_1).str.str._M_str;
          bVar4 = false;
        }
      }
      else {
        if (pRVar6->inst->type != String) goto LAB_00d22a43;
        pVVar7 = (Value *)(pRVar6->inst->field_1).str.str._M_str;
        bVar4 = false;
LAB_00d22748:
        s = (char *)0x0;
        args.inst = (Value *)0x0;
      }
      uVar3 = (undefined1)pVVar7->type;
      node_local.inst = pVVar7;
      while (uVar3 != String) {
        pVVar7 = (Value *)((long)&pVVar7->type + 1);
        iVar5 = isalnum((int)(char)uVar3);
        if (((iVar5 == 0) && (uVar3 != 0x5f)) && (uVar3 != 0x24)) {
          bVar4 = true;
          break;
        }
        uVar3 = (undefined1)pVVar7->type;
      }
      if (s != (char *)0x0) {
        emit(this,s);
        space(this);
      }
      if (bVar4) {
        maybeSpace(this,'\"');
        ensure(this,1);
        sVar2 = this->used;
        this->used = sVar2 + 1;
        this->buffer[sVar2] = '\"';
        emit(this,(char *)node_local.inst);
        maybeSpace(this,'\"');
        ensure(this,1);
        sVar2 = this->used;
        this->used = sVar2 + 1;
        this->buffer[sVar2] = '\"';
      }
      else {
        emit(this,(char *)node_local.inst);
      }
      if (s == (char *)0x0) {
        emit(this,":");
      }
      else {
        maybeSpace(this,'(');
        ensure(this,1);
        sVar2 = this->used;
        this->used = sVar2 + 1;
        this->buffer[sVar2] = '(';
        if (args.inst != (Value *)0x0) {
          emit(this,(char *)args.inst);
        }
        maybeSpace(this,')');
        ensure(this,1);
        sVar2 = this->used;
        this->used = sVar2 + 1;
        this->buffer[sVar2] = ')';
      }
      space(this);
      pRVar6 = Ref::operator[](&local_48,x);
      pRVar6 = Ref::operator[](pRVar6,1);
      print(this,pRVar6->inst);
      uVar8 = uVar8 + 1;
    } while ((local_48.inst)->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printObject(Ref node) {
    emit('{');
    indent++;
    newline();
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        pretty ? emit(", ") : emit(',');
        newline();
      }
      bool needQuote = false;
      const char* getterSetter = nullptr;
      const char* setterParam = nullptr;
      const char* str;
      if (args[i][0]->isArray()) {
        if (args[i][0][0] == STRING) {
          // A quoted string.
          needQuote = true;
          str = args[i][0][1]->getCString();
        } else if (args[i][0][0] == GETTER) {
          getterSetter = GETTER.str.data();
          str = args[i][0][1]->getCString();
        } else if (args[i][0][0] == SETTER) {
          getterSetter = SETTER.str.data();
          str = args[i][0][1]->getCString();
          setterParam = args[i][0][2]->getCString();
        } else {
          abort();
        }
      } else {
        // Just a raw string, no quotes.
        str = args[i][0]->getCString();
      }
      const char* check = str;
      while (*check) {
        if (!isalnum(*check) && *check != '_' && *check != '$') {
          needQuote = true;
          break;
        }
        check++;
      }
      if (getterSetter != nullptr) {
        emit(getterSetter);
        space();
      }
      if (needQuote) {
        emit('"');
      }
      emit(str);
      if (needQuote) {
        emit('"');
      }
      if (getterSetter != nullptr) {
        emit('(');
        if (setterParam != nullptr) {
          emit(setterParam);
        }
        emit(')');
      } else {
        emit(":");
      }
      space();
      print(args[i][1]);
    }
    indent--;
    newline();
    emit('}');
  }